

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1514.c
# Opt level: O0

size_t read_callback(void *ptr,size_t size,size_t nmemb,void *userp)

{
  WriteThis *pooh;
  void *userp_local;
  size_t nmemb_local;
  size_t size_local;
  void *ptr_local;
  
  if (size * nmemb == 0) {
    ptr_local = (void *)0x0;
  }
  else if (*(long *)((long)userp + 8) == 0) {
    ptr_local = (void *)0x0;
  }
  else {
    *(undefined1 *)ptr = **userp;
    *(long *)userp = *userp + 1;
    *(long *)((long)userp + 8) = *(long *)((long)userp + 8) + -1;
    ptr_local = (void *)0x1;
  }
  return (size_t)ptr_local;
}

Assistant:

static size_t read_callback(void *ptr, size_t size, size_t nmemb, void *userp)
{
  struct WriteThis *pooh = (struct WriteThis *)userp;

  if(size*nmemb < 1)
    return 0;

  if(pooh->sizeleft) {
    *(char *)ptr = pooh->readptr[0]; /* copy one single byte */
    pooh->readptr++;                 /* advance pointer */
    pooh->sizeleft--;                /* less data left */
    return 1;                        /* we return 1 byte at a time! */
  }

  return 0;                         /* no more data left to deliver */
}